

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::InPlaceOperator__(void *this,InPlaceOperator *o)

{
  undefined2 uVar1;
  
  uVar1 = *(undefined2 *)((long)this + 8);
  *(undefined2 *)((long)this + 8) = 0x101;
  (**(code **)(*this + 0x18))(this,(o->target).object);
  *(undefined2 *)((long)this + 8) = uVar1;
  (**(code **)(*this + 0x18))(this,(o->source).object);
  return;
}

Assistant:

void visit (AST::InPlaceOperator& o) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                visitObject (o.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (o.source);
            }